

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O2

NTRUEncodeSchedule * ntru_encode_ciphertext_schedule(uint p,uint q)

{
  ulong factor1;
  uint16_t *ms_in;
  NTRUEncodeSchedule *pNVar1;
  size_t i;
  ulong uVar2;
  
  factor1 = (ulong)p;
  ms_in = (uint16_t *)safemalloc(factor1,2,0);
  for (uVar2 = 0; factor1 != uVar2; uVar2 = uVar2 + 1) {
    ms_in[uVar2] = (short)((ulong)((q >> 1) + 1) / 3) * 2 + 1;
  }
  pNVar1 = ntru_encode_schedule(ms_in,factor1);
  safefree(ms_in);
  return pNVar1;
}

Assistant:

static NTRUEncodeSchedule *ntru_encode_ciphertext_schedule(
    unsigned p, unsigned q)
{
    unsigned m = ciphertext_m(q);
    uint16_t *ms = snewn(p, uint16_t);
    for (size_t i = 0; i < p; i++)
        ms[i] = m;
    NTRUEncodeSchedule *sched = ntru_encode_schedule(ms, p);
    sfree(ms);
    return sched;
}